

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_headers_filter_module.c
# Opt level: O1

char * ngx_http_headers_merge_conf(ngx_conf_t *cf,void *parent,void *child)

{
  int iVar1;
  
  if (*child == 6) {
    iVar1 = *parent;
    *(int *)child = iVar1;
    *(undefined8 *)((long)child + 8) = *(undefined8 *)((long)parent + 8);
    *(undefined8 *)((long)child + 0x10) = *(undefined8 *)((long)parent + 0x10);
    if (iVar1 == 6) {
      *(undefined4 *)child = 0;
    }
  }
  if (*(long *)((long)child + 0x18) == 0) {
    *(undefined8 *)((long)child + 0x18) = *(undefined8 *)((long)parent + 0x18);
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_headers_merge_conf(ngx_conf_t *cf, void *parent, void *child)
{
    ngx_http_headers_conf_t *prev = parent;
    ngx_http_headers_conf_t *conf = child;

    if (conf->expires == NGX_HTTP_EXPIRES_UNSET) {
        conf->expires = prev->expires;
        conf->expires_time = prev->expires_time;
        conf->expires_value = prev->expires_value;

        if (conf->expires == NGX_HTTP_EXPIRES_UNSET) {
            conf->expires = NGX_HTTP_EXPIRES_OFF;
        }
    }

    if (conf->headers == NULL) {
        conf->headers = prev->headers;
    }

    return NGX_CONF_OK;
}